

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

void av1_destroy_context_and_bufferpool(AV1_COMP *cpi,BufferPool **p_buffer_pool)

{
  av1_remove_compressor(cpi);
  if (*p_buffer_pool != (BufferPool *)0x0) {
    av1_free_ref_frame_buffers(*p_buffer_pool);
    pthread_mutex_destroy((pthread_mutex_t *)*p_buffer_pool);
    aom_free(*p_buffer_pool);
    *p_buffer_pool = (BufferPool *)0x0;
  }
  return;
}

Assistant:

void av1_destroy_context_and_bufferpool(AV1_COMP *cpi,
                                        BufferPool **p_buffer_pool) {
  av1_remove_compressor(cpi);
  if (*p_buffer_pool) {
    av1_free_ref_frame_buffers(*p_buffer_pool);
#if CONFIG_MULTITHREAD
    pthread_mutex_destroy(&(*p_buffer_pool)->pool_mutex);
#endif
    aom_free(*p_buffer_pool);
    *p_buffer_pool = NULL;
  }
}